

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcb_openssl.cpp
# Opt level: O0

void __thiscall ContextLocker::~ContextLocker(ContextLocker *this)

{
  ContextLocker *this_local;
  
  if (((this->m_cleanup & 1U) != 0) && (*this->m_context != (CTXPTR)0x0)) {
    EVP_CIPHER_CTX_reset(*this->m_context);
    EVP_CIPHER_CTX_free((EVP_CIPHER_CTX *)*this->m_context);
    *this->m_context = (CTXPTR)0x0;
  }
  return;
}

Assistant:

~ContextLocker() {
        if (m_cleanup && m_context) {
            EVP_CIPHER_CTX_cleanup(m_context);
            EVP_CIPHER_CTX_free(m_context);
            EVP_cleanup();
            m_context = nullptr;
        }
    }